

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QList<QByteArray> * __thiscall
QHash<QByteArray,_QTzTimeZone>::keys(QHash<QByteArray,_QTzTimeZone> *this)

{
  QList<QByteArray> *in_RDI;
  undefined1 in_stack_00000060 [16];
  undefined1 in_stack_00000070 [16];
  undefined8 local_30;
  QList<QByteArray> *this_00;
  
  this_00 = in_RDI;
  keyBegin(local_30);
  keyEnd(local_30);
  QList<QByteArray>::QList<QHash<QByteArray,_QTzTimeZone>::key_iterator,_true>
            (this_00,(key_iterator)in_stack_00000070,(key_iterator)in_stack_00000060);
  return in_RDI;
}

Assistant:

QList<Key> keys() const { return QList<Key>(keyBegin(), keyEnd()); }